

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O3

void __thiscall Privkey_NegateTest_Test::TestBody(Privkey_NegateTest_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  Privkey negate;
  Privkey privkey;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertHelper local_88;
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_70;
  string local_50;
  Privkey local_30;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"6a3f76d20a24aba37d97ad07bcb090499a64a76bb9d30e156d7e97285926cb89",
             "");
  cfd::core::Privkey::Privkey(&local_30,&local_50,kMainnet,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cfd::core::Privkey::CreateNegate((Privkey *)&local_50,&local_30);
  bVar1 = cfd::core::Privkey::Equals(&local_30,(Privkey *)&local_50);
  local_80[0] = (internal)!bVar1;
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,local_80,(AssertionResult *)"privkey.Equals(negate)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_privkey.cpp"
               ,0x112,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (((local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_90.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_90.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Privkey::CreateNegate((Privkey *)&local_70,(Privkey *)&local_50);
  local_80[0] = (internal)cfd::core::Privkey::Equals(&local_30,(Privkey *)&local_70);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70._M_dataplus._M_p == (char *)0x0) {
    if ((bool)local_80[0]) goto LAB_0026ecbe;
  }
  else {
    operator_delete(local_70._M_dataplus._M_p,
                    local_70.field_2._M_allocated_capacity - (long)local_70._M_dataplus._M_p);
    if (((byte)local_80[0] & 1) != 0) goto LAB_0026ecbe;
  }
  testing::Message::Message((Message *)&local_90);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_70,local_80,(AssertionResult *)"privkey.Equals(negate.CreateNegate())","false",
             "true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_privkey.cpp"
             ,0x113,local_70._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (((local_90.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_90.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_90.ptr_ + 8))();
  }
LAB_0026ecbe:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_50._M_dataplus._M_p,
                    local_50.field_2._M_allocated_capacity - (long)local_50._M_dataplus._M_p);
  }
  if (local_30.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Privkey, HasWif_compressed) {
  std::string wif = "cQNmd1D8MqzijUuXHb2yS5oRSm2F3TSTTMvcHC3V7CiKxArpg1bg";
  NetType net_type = NetType::kRegtest;
  bool is_compressed = false;
  bool has_wif = Privkey::HasWif(wif, &net_type, &is_compressed);
  EXPECT_TRUE(has_wif);
  EXPECT_TRUE(is_compressed);
  EXPECT_EQ(NetType::kTestnet, net_type);
}